

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::BufferMapWriteCase::iterate(BufferMapWriteCase *this)

{
  CallLogWrapper *this_00;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar1;
  int iVar2;
  deUint8 *ptr;
  TestError *this_01;
  char *description;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  BufferVerifier local_50;
  ReferenceBuffer local_48;
  
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_50,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&local_48,this->m_size);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_size,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,(long)this->m_size,(void *)0x0,this->m_usage);
  ptr = (deUint8 *)
        glu::CallLogWrapper::glMapBufferRange(this_00,this->m_bufferTarget,0,(long)this->m_size,2);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar1,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x86);
  if (ptr != (deUint8 *)0x0) {
    deqp::gls::BufferTestUtil::fillWithRandomBytes(ptr,this->m_size,seed);
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x8b);
    iVar2 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      (&local_50,(EVP_PKEY_CTX *)(ulong)buffer,
                       local_48.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,0,(uchar *)(ulong)(uint)this->m_size,
                       (ulong)this->m_bufferTarget);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    description = "Buffer verification failed";
    if ((byte)iVar2 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar2 ^ 1),description);
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_50);
    if (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x87);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);

		// Setup reference data.
		refBuf.setSize(m_size);
		fillWithRandomBytes(refBuf.getPtr(), m_size, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_size, DE_NULL, m_usage);

		void* ptr = glMapBufferRange(m_bufferTarget, 0, m_size, GL_MAP_WRITE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		fillWithRandomBytes((deUint8*)ptr, m_size, dataSeed);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_size, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}